

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O0

ssize_t read_stream(archive_read *a,void **buff,size_t size,size_t minimum)

{
  int iVar1;
  ssize_t sVar2;
  archive_read *in_RCX;
  undefined8 *in_RSI;
  archive *in_RDI;
  ssize_t skipped;
  ssize_t r;
  uint64_t skip_bytes;
  _7zip_conflict *zip;
  int in_stack_0000009c;
  _7z_folder *in_stack_000000a0;
  archive_read *in_stack_000000a8;
  size_t in_stack_ffffffffffffffc0;
  archive_read *a_00;
  void **buff_00;
  archive_read *local_8;
  
  buff_00 = *(void ***)in_RDI[0x15].archive_format_name;
  a_00 = (archive_read *)0x0;
  if (buff_00[0x1e] == (void *)0x0) {
    if (buff_00[0x23] == (void *)0x0) {
      if (buff_00[0x21] == (void *)0x0) {
        if (*(int *)((long)buff_00 + 0x114) == 0) {
          if (*(int *)(buff_00 + 0xd) != 0) {
            archive_set_error(in_RDI,-1,"Malformed 7-Zip archive");
            return -0x1e;
          }
          if ((*(int *)(buff_00 + 0x20) == 0) &&
             ((*(long *)((long)buff_00[7] +
                        (ulong)*(uint *)((long)buff_00[0x15] + 0x10) * 0x68 + 0x60) != 0 ||
              (*(int *)(buff_00 + 0x20) != *(int *)((long)buff_00[0x15] + 0x10))))) {
            *(undefined4 *)(buff_00 + 0x20) = *(undefined4 *)((long)buff_00[0x15] + 0x10);
            a_00 = *(archive_read **)
                    ((long)buff_00[7] + (ulong)*(uint *)(buff_00 + 0x20) * 0x68 + 0x60);
          }
          if (buff_00[6] <= (void *)(ulong)*(uint *)(buff_00 + 0x20)) {
            *in_RSI = 0;
            return 0;
          }
          iVar1 = setup_decode_folder(in_stack_000000a8,in_stack_000000a0,in_stack_0000009c);
          if (iVar1 != 0) {
            return -0x1e;
          }
          *(int *)(buff_00 + 0x20) = *(int *)(buff_00 + 0x20) + 1;
        }
        iVar1 = seek_pack(a_00);
        local_8 = (archive_read *)(long)iVar1;
        if ((-1 < (long)local_8) &&
           (local_8 = (archive_read *)extract_pack_stream((archive_read *)zip,skip_bytes),
           -1 < (long)local_8)) {
          while (a_00 != (archive_read *)0x0) {
            if (buff_00[0x1e] == (void *)0x0) {
              if (buff_00[0x23] == (void *)0x0) {
                if (buff_00[0x21] == (void *)0x0) {
                  archive_set_error(in_RDI,0x54,"Truncated 7-Zip file body");
                  return -0x1e;
                }
                local_8 = (archive_read *)extract_pack_stream((archive_read *)zip,skip_bytes);
              }
              else {
                local_8 = (archive_read *)extract_pack_stream((archive_read *)zip,skip_bytes);
              }
              if ((long)local_8 < 0) {
                return (ssize_t)local_8;
              }
            }
            sVar2 = get_uncompressed_data(in_RCX,buff_00,(size_t)a_00,(size_t)local_8);
            if (sVar2 < 0) {
              return sVar2;
            }
            a_00 = (archive_read *)((long)a_00 - sVar2);
            if (buff_00[0x24] != (void *)0x0) {
              read_consume(local_8);
            }
          }
          local_8 = (archive_read *)get_uncompressed_data(in_RCX,buff_00,0,(size_t)local_8);
        }
      }
      else {
        local_8 = (archive_read *)extract_pack_stream((archive_read *)zip,skip_bytes);
        if (-1 < (long)local_8) {
          local_8 = (archive_read *)
                    get_uncompressed_data(in_RCX,buff_00,(size_t)a_00,(size_t)local_8);
        }
      }
    }
    else {
      local_8 = (archive_read *)extract_pack_stream((archive_read *)zip,skip_bytes);
      if (-1 < (long)local_8) {
        local_8 = (archive_read *)get_uncompressed_data(in_RCX,buff_00,(size_t)a_00,(size_t)local_8)
        ;
      }
    }
  }
  else {
    local_8 = (archive_read *)get_uncompressed_data(in_RCX,buff_00,0,in_stack_ffffffffffffffc0);
  }
  return (ssize_t)local_8;
}

Assistant:

static ssize_t
read_stream(struct archive_read *a, const void **buff, size_t size,
    size_t minimum)
{
	struct _7zip *zip = (struct _7zip *)a->format->data;
	uint64_t skip_bytes = 0;
	ssize_t r;

	if (zip->uncompressed_buffer_bytes_remaining == 0) {
		if (zip->pack_stream_inbytes_remaining > 0) {
			r = extract_pack_stream(a, 0);
			if (r < 0)
				return (r);
			return (get_uncompressed_data(a, buff, size, minimum));
		} else if (zip->folder_outbytes_remaining > 0) {
			/* Extract a remaining pack stream. */
			r = extract_pack_stream(a, 0);
			if (r < 0)
				return (r);
			return (get_uncompressed_data(a, buff, size, minimum));
		}
	} else
		return (get_uncompressed_data(a, buff, size, minimum));

	/*
	 * Current pack stream has been consumed.
	 */
	if (zip->pack_stream_remaining == 0) {
		if (zip->header_is_being_read) {
			/* Invalid sequence. This might happen when
			 * reading a malformed archive. */
			archive_set_error(&(a->archive),
			    ARCHIVE_ERRNO_MISC, "Malformed 7-Zip archive");
			return (ARCHIVE_FATAL);
		}

		/*
		 * All current folder's pack streams have been
		 * consumed. Switch to next folder.
		 */
		if (zip->folder_index == 0 &&
		    (zip->si.ci.folders[zip->entry->folderIndex].skipped_bytes
		     || zip->folder_index != zip->entry->folderIndex)) {
			zip->folder_index = zip->entry->folderIndex;
			skip_bytes =
			    zip->si.ci.folders[zip->folder_index].skipped_bytes;
		}

		if (zip->folder_index >= zip->si.ci.numFolders) {
			/*
			 * We have consumed all folders and its pack streams.
			 */
			*buff = NULL;
			return (0);
		}
		r = setup_decode_folder(a,
			&(zip->si.ci.folders[zip->folder_index]), 0);
		if (r != ARCHIVE_OK)
			return (ARCHIVE_FATAL);

		zip->folder_index++;
	}

	/*
	 * Switch to next pack stream.
	 */
	r = seek_pack(a);
	if (r < 0)
		return (r);

	/* Extract a new pack stream. */
	r = extract_pack_stream(a, 0);
	if (r < 0)
		return (r);

	/*
	 * Skip the bytes we alrady has skipped in skip_stream().
	 */
	while (skip_bytes) {
		ssize_t skipped;

		if (zip->uncompressed_buffer_bytes_remaining == 0) {
			if (zip->pack_stream_inbytes_remaining > 0) {
				r = extract_pack_stream(a, 0);
				if (r < 0)
					return (r);
			} else if (zip->folder_outbytes_remaining > 0) {
				/* Extract a remaining pack stream. */
				r = extract_pack_stream(a, 0);
				if (r < 0)
					return (r);
			} else {
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_FILE_FORMAT,
				    "Truncated 7-Zip file body");
				return (ARCHIVE_FATAL);
			}
		}
		skipped = get_uncompressed_data(
			a, buff, (size_t)skip_bytes, 0);
		if (skipped < 0)
			return (skipped);
		skip_bytes -= skipped;
		if (zip->pack_stream_bytes_unconsumed)
			read_consume(a);
	}

	return (get_uncompressed_data(a, buff, size, minimum));
}